

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintBool_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,bool val)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  StringBaseTextGenerator generator;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_30 = 0;
  local_28[0] = 0;
  pcVar1 = "false";
  if ((int)CONCAT71(in_register_00000011,val) != 0) {
    pcVar1 = "true";
  }
  local_38 = local_28;
  std::__cxx11::string::append((char *)&local_38,(ulong)pcVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintBool(bool val) const {
  FORWARD_IMPL(PrintBool, val);
}